

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::SetWindowCollapsed(ImGuiWindow *window,bool collapsed,ImGuiCond cond)

{
  if (cond == 0 || (window->SetWindowCollapsedAllowFlags & cond) != 0) {
    window->SetWindowCollapsedAllowFlags = window->SetWindowCollapsedAllowFlags & 0xfffffff1;
    window->Collapsed = collapsed;
  }
  return;
}

Assistant:

void ImGui::SetWindowCollapsed(ImGuiWindow* window, bool collapsed, ImGuiCond cond)
{
    // Test condition (NB: bit 0 is always true) and clear flags for next time
    if (cond && (window->SetWindowCollapsedAllowFlags & cond) == 0)
        return;
    window->SetWindowCollapsedAllowFlags &= ~(ImGuiCond_Once | ImGuiCond_FirstUseEver | ImGuiCond_Appearing);

    // Set
    window->Collapsed = collapsed;
}